

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ConstantValue::convertToReal(ConstantValue *__return_storage_ptr__,ConstantValue *this)

{
  bool bVar1;
  SVInt *this_00;
  float fVar2;
  double v;
  real_t local_30;
  shortreal_t local_24;
  real_t local_20;
  ConstantValue *local_18;
  ConstantValue *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  bVar1 = isReal(this);
  if (bVar1) {
    ConstantValue(__return_storage_ptr__,this);
  }
  else {
    bVar1 = isShortReal(this);
    if (bVar1) {
      local_24 = shortReal(this);
      fVar2 = shortreal_t::operator_cast_to_float(&local_24);
      real_t::real_t(&local_20,(double)fVar2);
      ConstantValue(__return_storage_ptr__,local_20);
    }
    else {
      bVar1 = isInteger(this);
      if (bVar1) {
        this_00 = integer(this);
        v = SVInt::toDouble(this_00);
        real_t::real_t(&local_30,v);
        ConstantValue(__return_storage_ptr__,local_30);
      }
      else {
        ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue ConstantValue::convertToReal() const {
    if (isReal())
        return *this;

    if (isShortReal())
        return real_t(shortReal());

    if (isInteger())
        return real_t(integer().toDouble());

    return nullptr;
}